

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# throw_exception.hpp
# Opt level: O2

void boost::throw_exception<std::invalid_argument>(invalid_argument *e)

{
  clone_impl<boost::exception_detail::error_info_injector<std::invalid_argument>_> *this;
  error_info_injector<std::invalid_argument> local_50;
  
  this = (clone_impl<boost::exception_detail::error_info_injector<std::invalid_argument>_> *)
         __cxa_allocate_exception(0x40);
  exception_detail::error_info_injector<std::invalid_argument>::error_info_injector(&local_50,e);
  exception_detail::clone_impl<boost::exception_detail::error_info_injector<std::invalid_argument>_>
  ::clone_impl(this,&local_50);
  __cxa_throw(this,&exception_detail::
                    clone_impl<boost::exception_detail::error_info_injector<std::invalid_argument>>
                    ::typeinfo,
              exception_detail::
              clone_impl<boost::exception_detail::error_info_injector<std::invalid_argument>_>::
              ~clone_impl);
}

Assistant:

BOOST_NORETURN inline void throw_exception( E const & e )
{
    //All boost exceptions are required to derive from std::exception,
    //to ensure compatibility with BOOST_NO_EXCEPTIONS.
    throw_exception_assert_compatibility(e);

#ifndef BOOST_EXCEPTION_DISABLE
    throw enable_current_exception(enable_error_info(e));
#else
    throw e;
#endif
}